

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void calculateShadowEdgesRoi(Mat *img,Rect *roi_to_clear,Mat *edge_image,int canny_thrs)

{
  int in_R8D;
  undefined8 local_160;
  Mat *local_158;
  undefined8 local_150;
  undefined4 local_148 [2];
  _InputArray *local_140;
  undefined8 local_138;
  undefined4 local_130 [2];
  Mat *local_128;
  undefined8 local_120;
  _InputArray local_118;
  undefined8 local_f8;
  undefined8 local_f0;
  _InputArray local_e8 [4];
  Mat img_gray;
  
  cv::Mat::Mat(&img_gray);
  if ((*(ushort *)img & 0xff8) == 0) {
    cv::Mat::operator=(&img_gray,img);
  }
  else {
    local_e8[0].sz.width = 0;
    local_e8[0].sz.height = 0;
    local_118.sz.width = 0;
    local_118.sz.height = 0;
    local_e8[0].flags = 0x1010000;
    local_118.flags = 0x2010000;
    local_118.obj = &img_gray;
    local_e8[0].obj = img;
    cv::cvtColor((cv *)local_e8,&local_118,(_OutputArray *)0x6,0,in_R8D);
  }
  local_e8[0].sz.width = 0;
  local_e8[0].sz.height = 0;
  local_e8[0].flags = 0x1010000;
  local_118.sz.width = 0;
  local_118.sz.height = 0;
  local_118.flags = 0x2010000;
  local_118.obj = edge_image;
  local_e8[0].obj = &img_gray;
  cv::Canny(local_e8,(_OutputArray *)&local_118,(double)canny_thrs,(double)canny_thrs,3,false);
  cv::Mat::Mat((Mat *)local_e8,edge_image,(Rect_ *)roi_to_clear);
  local_118.obj = &local_160;
  local_160 = 0;
  local_118.flags = -0x3efdfffa;
  local_118.sz.width = 1;
  local_118.sz.height = 1;
  cv::noArray();
  cv::Mat::setTo(local_e8,&local_118);
  cv::Mat::~Mat((Mat *)local_e8);
  local_150 = 0;
  local_120 = 0;
  local_160._0_4_ = 0x1010000;
  local_130[0] = 0x2010000;
  local_158 = edge_image;
  local_128 = edge_image;
  cv::Mat::Mat((Mat *)local_e8);
  local_138 = 0;
  local_148[0] = 0x1010000;
  local_f0 = 0xffffffffffffffff;
  local_140 = local_e8;
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_160,local_130,local_148,&local_f0,1,0,&local_118);
  cv::Mat::~Mat((Mat *)local_e8);
  local_150 = 0;
  local_120 = 0;
  local_160 = CONCAT44(local_160._4_4_,0x1010000);
  local_130[0] = 0x2010000;
  local_158 = edge_image;
  local_128 = edge_image;
  cv::Mat::Mat((Mat *)local_e8);
  local_138 = 0;
  local_148[0] = 0x1010000;
  local_f8 = 0xffffffffffffffff;
  local_140 = local_e8;
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_160,local_130,local_148,&local_f8,1,0,&local_118);
  cv::Mat::~Mat((Mat *)local_e8);
  cv::Mat::~Mat(&img_gray);
  return;
}

Assistant:

void calculateShadowEdgesRoi(const cv::Mat& img,
    const cv::Rect& roi_to_clear,
    cv::Mat& edge_image,
    int canny_thrs)
{
    cv::Mat img_gray;
    if (img.channels() == 1)
    {
        img_gray = img;
    }
    else
    {
        cv::cvtColor(img, img_gray, cv::COLOR_BGR2GRAY);
    }
    cv::Canny(img_gray, edge_image, canny_thrs, canny_thrs);
    edge_image(roi_to_clear).setTo(0);
    cv::dilate(edge_image, edge_image, cv::Mat());
    cv::dilate(edge_image, edge_image, cv::Mat());
}